

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command-line.cpp
# Opt level: O1

void __thiscall wasm::Options::parse(Options *this,int argc,char **argv)

{
  Action *pAVar1;
  string *this_00;
  _Base_ptr p_Var2;
  Arguments AVar3;
  pointer pOVar4;
  _Base_ptr __s;
  undefined8 __s2;
  int iVar5;
  _Alloc_hider _Var6;
  long lVar7;
  ostream *poVar8;
  pointer pcVar9;
  _Alloc_hider _Var10;
  pointer pOVar11;
  Option *o;
  pointer pOVar12;
  size_t sVar13;
  pointer local_b8 [2];
  undefined1 local_a8 [56];
  undefined1 local_70 [8];
  string argument;
  string currentOption;
  
  if (argc < 1) {
    __assert_fail("argc > 0 && \"expect at least program name as an argument\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/command-line.cpp"
                  ,0xc0,"void wasm::Options::parse(int, const char **)");
  }
  if (argc != 1) {
    local_a8._16_8_ = ZEXT48((uint)argc);
    pAVar1 = &this->positionalAction;
    local_a8._32_8_ = (_Base_ptr)0x1;
    sVar13 = 0;
    local_a8._24_8_ = argv;
    local_a8._40_8_ = this;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(argument.field_2._M_local_buf + 8),
                 *(char **)(&((_Base_ptr)argv)->_M_color + local_a8._32_8_ * 2),
                 (allocator<char> *)local_70);
      if (currentOption._M_dataplus._M_p == (pointer)0x0) {
        _Var10._M_p = (pointer)0x0;
      }
      else {
        pcVar9 = (pointer)0x0;
        do {
          _Var10._M_p = pcVar9;
          if (pcVar9[argument.field_2._8_8_] != '-') break;
          pcVar9 = pcVar9 + 1;
          _Var10 = currentOption._M_dataplus;
        } while (currentOption._M_dataplus._M_p != pcVar9);
      }
      _Var6 = currentOption._M_dataplus;
      if (_Var10._M_p < currentOption._M_dataplus._M_p) {
        _Var6._M_p = _Var10._M_p;
      }
      if ((_Var6._M_p == (pointer)0x0) ||
         (iVar5 = std::__cxx11::string::compare(argument.field_2._M_local_buf + 8), iVar5 == 0)) {
        switch(*(undefined4 *)&(((pointer)this)->description).field_2) {
        case 0:
        case 3:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Unexpected positional argument \'",0x20);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,(char *)argument.field_2._8_8_,
                              (long)currentOption._M_dataplus._M_p);
          std::operator<<(poVar8,"\'\n");
          goto LAB_00c38b8b;
        case 1:
          if (sVar13 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Unexpected second positional argument \'",0x27);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,(char *)argument.field_2._8_8_,
                                (long)currentOption._M_dataplus._M_p);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\' for ",6);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,*(char **)((long)&((string *)(local_a8._40_8_ + 0x40))->
                                                         field_2 + 8),
                                (long)(((string *)(local_a8._40_8_ + 0x60))->_M_dataplus)._M_p);
            std::operator<<(poVar8,'\n');
            goto LAB_00c38b8b;
          }
        case 2:
          local_70 = (undefined1  [8])this;
          if (*(_Manager_type *)&(((pointer)this)->action).super__Function_base._M_functor ==
              (_Manager_type)0x0) {
            std::__throw_bad_function_call();
          }
          (**(code **)((long)&(((pointer)this)->action).super__Function_base._M_functor + 8))
                    ((_Any_data *)pAVar1,(Options **)local_70,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&argument.field_2 + 8));
          sVar13 = sVar13 + 1;
        }
      }
      else {
        argument._M_dataplus._M_p = (pointer)0x0;
        argument._M_string_length._0_1_ = 0;
        this_00 = (string *)(&argument.field_2._M_allocated_capacity + 1);
        local_a8._48_8_ = sVar13;
        local_70 = (undefined1  [8])&argument._M_string_length;
        lVar7 = std::__cxx11::string::find((char)this_00,0x3d);
        if (lVar7 != -1) {
          std::__cxx11::string::substr((ulong)local_b8,(ulong)this_00);
          std::__cxx11::string::operator=((string *)local_70,(string *)local_b8);
          if (local_b8[0] != (pointer)local_a8) {
            operator_delete(local_b8[0],(ulong)(local_a8._0_8_ + 1));
          }
          std::__cxx11::string::substr((ulong)local_b8,(ulong)this_00);
          std::__cxx11::string::operator=(this_00,(string *)local_b8);
          if (local_b8[0] != (pointer)local_a8) {
            operator_delete(local_b8[0],(ulong)(local_a8._0_8_ + 1));
          }
        }
        _Var10._M_p = currentOption._M_dataplus._M_p;
        __s2 = argument.field_2._8_8_;
        pOVar12 = *(pointer *)((long)&(((pointer)this)->shortName).field_2 + 8);
        pOVar4 = (pointer)(((pointer)this)->description)._M_dataplus._M_p;
        if (pOVar12 == pOVar4) {
          pOVar11 = (pointer)0x0;
        }
        else {
          pOVar11 = (pointer)0x0;
          do {
            pcVar9 = (pointer)(pOVar12->longName)._M_string_length;
            if (((pcVar9 == _Var10._M_p) &&
                ((pcVar9 == (pointer)0x0 ||
                 (iVar5 = bcmp((pOVar12->longName)._M_dataplus._M_p,(void *)__s2,(size_t)pcVar9),
                 iVar5 == 0)))) ||
               ((pcVar9 = (pointer)(pOVar12->shortName)._M_string_length, pcVar9 == _Var10._M_p &&
                ((pcVar9 == (pointer)0x0 ||
                 (iVar5 = bcmp((pOVar12->shortName)._M_dataplus._M_p,(void *)__s2,(size_t)pcVar9),
                 iVar5 == 0)))))) {
              pOVar11 = pOVar12;
            }
            pOVar12 = pOVar12 + 1;
          } while (pOVar12 != pOVar4);
        }
        if (pOVar11 == (pointer)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Unknown option \'",0x10);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,(char *)argument.field_2._8_8_,
                              (long)currentOption._M_dataplus._M_p);
          std::operator<<(poVar8,"\'\n");
          goto LAB_00c38b8b;
        }
        AVar3 = pOVar11->arguments;
        if (AVar3 == N) {
LAB_00c38a22:
          if (argument._M_dataplus._M_p == (pointer)0x0) {
            p_Var2 = (_Base_ptr)(local_a8._32_8_ + 1);
            if (p_Var2 == (_Base_ptr)local_a8._16_8_) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Couldn\'t find expected argument for \'",0x25);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cerr,(char *)argument.field_2._8_8_,
                                  (long)currentOption._M_dataplus._M_p);
              std::operator<<(poVar8,"\'\n");
LAB_00c38b8b:
              exit(1);
            }
            __s = ((_Base_ptr *)(local_a8._24_8_ + 8))[local_a8._32_8_];
            strlen((char *)__s);
            std::__cxx11::string::_M_replace((ulong)local_70,0,(char *)0x0,(ulong)__s);
            local_a8._32_8_ = p_Var2;
          }
        }
        else {
          if (AVar3 == One) {
            if (pOVar11->seen != 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Unexpected second argument \'",0x1c);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cerr,(char *)local_70,
                                  (long)argument._M_dataplus._M_p);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\' for \'",7);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar8,(char *)argument.field_2._8_8_,
                                  (long)currentOption._M_dataplus._M_p);
              std::operator<<(poVar8,"\'\n");
              goto LAB_00c38b8b;
            }
            goto LAB_00c38a22;
          }
          if ((AVar3 == Zero) && (argument._M_dataplus._M_p != (pointer)0x0)) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Unexpected argument \'",0x15);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,(char *)local_70,
                                (long)argument._M_dataplus._M_p);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\' for option \'",0xe);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,(char *)argument.field_2._8_8_,
                                (long)currentOption._M_dataplus._M_p);
            std::operator<<(poVar8,"\'\n");
            goto LAB_00c38b8b;
          }
        }
        sVar13 = local_a8._48_8_;
        this = (Options *)local_a8._40_8_;
        local_b8[0] = (pointer)local_a8._40_8_;
        if ((pOVar11->action).super__Function_base._M_manager == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
        }
        (*(pOVar11->action)._M_invoker)
                  ((_Any_data *)&pOVar11->action,(Options **)local_b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
        pOVar11->seen = pOVar11->seen + 1;
        argv = (char **)local_a8._24_8_;
        if (local_70 != (undefined1  [8])&argument._M_string_length) {
          operator_delete((void *)local_70,
                          CONCAT71(argument._M_string_length._1_7_,
                                   (undefined1)argument._M_string_length) + 1);
          argv = (char **)local_a8._24_8_;
        }
      }
      if ((size_type *)argument.field_2._8_8_ != &currentOption._M_string_length) {
        operator_delete((void *)argument.field_2._8_8_,currentOption._M_string_length + 1);
      }
      local_a8._32_8_ = local_a8._32_8_ + 1;
    } while (local_a8._32_8_ != local_a8._16_8_);
  }
  return;
}

Assistant:

void Options::parse(int argc, const char* argv[]) {

// On Windows, get the wide char version of the command line flags, and convert
// each one to std::string with UTF-8 manually. This means that all paths in
// Binaryen are stored this way on all platforms right up until a library call
// is made to open a file (at which point we use Path::to_path to convert back)
// so that it works with the underlying Win32 APIs.
// Only argList (and not argv) should be used below.
#ifdef USE_WSTRING_PATHS
  LPWSTR* argListW = CommandLineToArgvW(GetCommandLineW(), &argc);
  std::vector<std::string> argList;
  for (size_t i = 0, e = argc; i < e; ++i) {
    argList.push_back(wasm::Path::wstring_to_string(argListW[i]));
  }
#else
  const char** argList = argv;
#endif

  assert(argc > 0 && "expect at least program name as an argument");
  size_t positionalsSeen = 0;
  auto dashes = [](const std::string& s) {
    for (size_t i = 0; i < s.size(); ++i) {
      if (s[i] != '-') {
        return i;
      }
    }
    return s.size();
  };
  for (size_t i = 1, e = argc; i != e; ++i) {
    std::string currentOption = argList[i];

    // "-" alone is a positional option
    if (dashes(currentOption) == 0 || currentOption == "-") {
      // Positional.
      switch (positional) {
        case Arguments::Zero:
          // Optional arguments must use --flag=A format, and not separated by
          // spaces (which would be ambiguous).
        case Arguments::Optional:
          std::cerr << "Unexpected positional argument '" << currentOption
                    << "'\n";
          exit(EXIT_FAILURE);
        case Arguments::One:
          if (positionalsSeen) {
            std::cerr << "Unexpected second positional argument '"
                      << currentOption << "' for " << positionalName << '\n';
            exit(EXIT_FAILURE);
          }
          [[fallthrough]];
        case Arguments::N:
          positionalAction(this, currentOption);
          ++positionalsSeen;
          break;
      }
      continue;
    }

    // Non-positional.
    std::string argument;
    auto equal = currentOption.find_first_of('=');
    if (equal != std::string::npos) {
      argument = currentOption.substr(equal + 1);
      currentOption = currentOption.substr(0, equal);
    }
    Option* option = nullptr;
    for (auto& o : options) {
      if (o.longName == currentOption || o.shortName == currentOption) {
        option = &o;
      }
    }
    if (!option) {
      std::cerr << "Unknown option '" << currentOption << "'\n";
      exit(EXIT_FAILURE);
    }
    switch (option->arguments) {
      case Arguments::Zero:
        if (argument.size()) {
          std::cerr << "Unexpected argument '" << argument << "' for option '"
                    << currentOption << "'\n";
          exit(EXIT_FAILURE);
        }
        break;
      case Arguments::One:
        if (option->seen) {
          std::cerr << "Unexpected second argument '" << argument << "' for '"
                    << currentOption << "'\n";
          exit(EXIT_FAILURE);
        }
        [[fallthrough]];
      case Arguments::N:
        if (!argument.size()) {
          if (i + 1 == e) {
            std::cerr << "Couldn't find expected argument for '"
                      << currentOption << "'\n";
            exit(EXIT_FAILURE);
          }
          argument = argList[++i];
        }
        break;
      case Arguments::Optional:
        break;
    }
    option->action(this, argument);
    ++option->seen;
  }
}